

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O3

int Fraig_CompareSimInfoUnderMask
              (Fraig_Node_t *pNode1,Fraig_Node_t *pNode2,int iWordLast,int fUseRand,uint *puMask)

{
  ulong uVar1;
  
  if (((ulong)pNode1 & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pNode1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fraig/fraigTable.c"
                  ,0x1c7,
                  "int Fraig_CompareSimInfoUnderMask(Fraig_Node_t *, Fraig_Node_t *, int, int, unsigned int *)"
                 );
  }
  if (((ulong)pNode2 & 1) == 0) {
    if (0 < iWordLast) {
      uVar1 = 0;
      do {
        if ((puMask[uVar1] &
            ((&pNode2->puSimR)[fUseRand == 0][uVar1] ^ (&pNode1->puSimR)[fUseRand == 0][uVar1])) !=
            0) {
          return 0;
        }
        uVar1 = uVar1 + 1;
      } while ((uint)iWordLast != uVar1);
    }
    return 1;
  }
  __assert_fail("!Fraig_IsComplement(pNode2)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fraig/fraigTable.c"
                ,0x1c8,
                "int Fraig_CompareSimInfoUnderMask(Fraig_Node_t *, Fraig_Node_t *, int, int, unsigned int *)"
               );
}

Assistant:

int Fraig_CompareSimInfoUnderMask( Fraig_Node_t * pNode1, Fraig_Node_t * pNode2, int iWordLast, int fUseRand, unsigned * puMask )
{
    unsigned * pSims1, * pSims2;
    int i;
    assert( !Fraig_IsComplement(pNode1) );
    assert( !Fraig_IsComplement(pNode2) );
    // get hold of simulation info
    pSims1 = fUseRand? pNode1->puSimR : pNode1->puSimD;
    pSims2 = fUseRand? pNode2->puSimR : pNode2->puSimD;    
    // check the simulation info
    for ( i = 0; i < iWordLast; i++ )
        if ( (pSims1[i] & puMask[i]) != (pSims2[i] & puMask[i]) )
            return 0;
    return 1;
}